

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O1

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImDrawList *pIVar5;
  ImDrawCmd *pIVar6;
  code *pcVar7;
  GLboolean GVar8;
  GLboolean GVar9;
  GLboolean GVar10;
  GLboolean GVar11;
  PFNGLENABLEPROC *pp_Var12;
  int fb_height;
  long lVar13;
  int fb_width;
  ImDrawData *draw_data_00;
  long lVar14;
  PFNGLENABLEPROC *pp_Var15;
  long lVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  GLuint vertex_array_object;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLenum last_clip_origin;
  GLint last_polygon_mode [2];
  GLuint local_ac;
  ImDrawData *local_a8;
  int local_a0;
  float local_9c;
  GLenum local_98;
  GLenum local_94;
  GLenum local_90;
  GLenum local_8c;
  GLenum local_88;
  GLenum local_84;
  GLuint local_80;
  GLuint local_7c;
  GLuint local_78;
  GLuint local_74;
  GLuint local_70;
  GLenum local_6c;
  GLint local_68;
  GLint local_64;
  GLsizei local_60;
  GLsizei local_5c;
  GLint local_58;
  GLint local_54;
  GLsizei local_50;
  GLsizei local_4c;
  GLint local_3c;
  GLenum local_38 [2];
  
  fb_width = (int)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  fb_height = (int)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  if (0 < fb_height && 0 < fb_width) {
    local_a8 = draw_data;
    (*glad_glGetIntegerv)(0x84e0,(GLint *)&local_6c);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glGetIntegerv)(0x8b8d,(GLint *)&local_70);
    (*glad_glGetIntegerv)(0x8069,(GLint *)&local_74);
    (*glad_glGetIntegerv)(0x8919,(GLint *)&local_78);
    (*glad_glGetIntegerv)(0x8894,(GLint *)&local_7c);
    (*glad_glGetIntegerv)(0x85b5,(GLint *)&local_80);
    (*glad_glGetIntegerv)(0xb40,(GLint *)local_38);
    (*glad_glGetIntegerv)(0xba2,&local_58);
    (*glad_glGetIntegerv)(0xc10,&local_68);
    (*glad_glGetIntegerv)(0x80c9,(GLint *)&local_84);
    (*glad_glGetIntegerv)(0x80c8,(GLint *)&local_88);
    (*glad_glGetIntegerv)(0x80cb,(GLint *)&local_8c);
    (*glad_glGetIntegerv)(0x80ca,(GLint *)&local_90);
    (*glad_glGetIntegerv)(0x8009,(GLint *)&local_94);
    (*glad_glGetIntegerv)(0x883d,(GLint *)&local_98);
    GVar8 = (*glad_glIsEnabled)(0xbe2);
    GVar9 = (*glad_glIsEnabled)(0xb44);
    GVar10 = (*glad_glIsEnabled)(0xb71);
    GVar11 = (*glad_glIsEnabled)(0xc11);
    local_3c = 0;
    (*glad_glGetIntegerv)(0x935c,&local_3c);
    draw_data_00 = local_a8;
    local_a0 = local_3c;
    local_ac = 0;
    (*glad_glGenVertexArrays)(1,&local_ac);
    ImGui_ImplOpenGL3_SetupRenderState(draw_data_00,fb_width,fb_height,local_ac);
    if (0 < draw_data_00->CmdListsCount) {
      fVar1 = (draw_data_00->DisplayPos).x;
      local_9c = (float)fb_width;
      fVar2 = (draw_data_00->DisplayPos).y;
      fVar3 = (draw_data_00->FramebufferScale).x;
      fVar4 = (draw_data_00->FramebufferScale).y;
      lVar16 = 0;
      do {
        pIVar5 = draw_data_00->CmdLists[lVar16];
        (*glad_glBufferData)
                  (0x8892,(long)(pIVar5->VtxBuffer).Size * 0x14,(pIVar5->VtxBuffer).Data,0x88e0);
        (*glad_glBufferData)
                  (0x8893,(long)(pIVar5->IdxBuffer).Size * 2,(pIVar5->IdxBuffer).Data,0x88e0);
        if (0 < (pIVar5->CmdBuffer).Size) {
          lVar13 = 0;
          lVar14 = 0;
          do {
            pIVar6 = (pIVar5->CmdBuffer).Data;
            pcVar7 = *(code **)((long)&pIVar6->UserCallback + lVar13);
            if (pcVar7 == (code *)0x0) {
              fVar17 = (*(float *)((long)&(pIVar6->ClipRect).x + lVar13) - fVar1) * fVar3;
              if ((((fVar17 < local_9c) &&
                   (fVar18 = (*(float *)((long)&(pIVar6->ClipRect).y + lVar13) - fVar2) * fVar4,
                   fVar18 < (float)fb_height)) &&
                  (fVar19 = (*(float *)((long)&(pIVar6->ClipRect).z + lVar13) - fVar1) * fVar3,
                  0.0 <= fVar19)) &&
                 (fVar20 = (*(float *)((long)&(pIVar6->ClipRect).w + lVar13) - fVar2) * fVar4,
                 0.0 <= fVar20)) {
                if (local_a0 != 0x8ca2) {
                  fVar21 = (float)fb_height - fVar20;
                  fVar19 = fVar19 - fVar17;
                  fVar20 = fVar20 - fVar18;
                  fVar18 = fVar21;
                }
                (*glad_glScissor)((int)fVar17,(int)fVar18,(int)fVar19,(int)fVar20);
                (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&pIVar6->TextureId + lVar13));
                (*glad_glDrawElements)
                          (4,*(GLsizei *)((long)&pIVar6->ElemCount + lVar13),0x1403,
                           (void *)((ulong)*(uint *)((long)&pIVar6->IdxOffset + lVar13) * 2));
              }
            }
            else if (pcVar7 == (code *)0xffffffffffffffff) {
              ImGui_ImplOpenGL3_SetupRenderState(local_a8,fb_width,fb_height,local_ac);
            }
            else {
              (*pcVar7)(pIVar5,(long)&pIVar6->ElemCount + lVar13);
            }
            lVar14 = lVar14 + 1;
            lVar13 = lVar13 + 0x38;
          } while (lVar14 < (pIVar5->CmdBuffer).Size);
        }
        lVar16 = lVar16 + 1;
        draw_data_00 = local_a8;
      } while (lVar16 < local_a8->CmdListsCount);
    }
    (*glad_glDeleteVertexArrays)(1,&local_ac);
    (*glad_glUseProgram)(local_70);
    (*glad_glBindTexture)(0xde1,local_74);
    (*glad_glBindSampler)(0,local_78);
    (*glad_glActiveTexture)(local_6c);
    (*glad_glBindVertexArray)(local_80);
    (*glad_glBindBuffer)(0x8892,local_7c);
    (*glad_glBlendEquationSeparate)(local_94,local_98);
    (*glad_glBlendFuncSeparate)(local_84,local_88,local_8c,local_90);
    pp_Var15 = &glad_glEnable;
    pp_Var12 = &glad_glEnable;
    if (GVar8 == '\0') {
      pp_Var12 = &glad_glDisable;
    }
    (**pp_Var12)(0xbe2);
    pp_Var12 = &glad_glEnable;
    if (GVar9 == '\0') {
      pp_Var12 = &glad_glDisable;
    }
    (**pp_Var12)(0xb44);
    pp_Var12 = &glad_glEnable;
    if (GVar10 == '\0') {
      pp_Var12 = &glad_glDisable;
    }
    (**pp_Var12)(0xb71);
    if (GVar11 == '\0') {
      pp_Var15 = &glad_glDisable;
    }
    (**pp_Var15)(0xc11);
    (*glad_glPolygonMode)(0x408,local_38[0]);
    (*glad_glViewport)(local_58,local_54,local_50,local_4c);
    (*glad_glScissor)(local_68,local_64,local_60,local_5c);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_HAS_DRAW_WITH_BASE_VERTEX
                    glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
#else
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
#endif
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}